

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O3

void nsvg__parseStyle(NSVGparser *p,char *str)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  void *pvVar4;
  char *pcVar5;
  char cVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  size_t sVar11;
  bool bVar12;
  char name [512];
  char value [512];
  char local_438 [512];
  char local_238 [520];
  
  cVar6 = *str;
  do {
    if (cVar6 == '\0') {
      return;
    }
    do {
      pvVar4 = memchr(" \t\n\v\f\r",(int)cVar6,7);
      pcVar8 = str;
      if (pvVar4 == (void *)0x0) goto LAB_00115c21;
      cVar6 = str[1];
      str = str + 1;
    } while (cVar6 != '\0');
    cVar6 = '\0';
    pcVar8 = str;
LAB_00115c21:
    while ((pcVar2 = str, pcVar9 = str, cVar6 != '\0' && (cVar6 != ';'))) {
      pcVar2 = str + 1;
      str = str + 1;
      cVar6 = *pcVar2;
    }
    while ((pcVar8 < pcVar2 &&
           ((*pcVar2 == 0x3b ||
            (pvVar4 = memchr(" \t\n\v\f\r",(int)*pcVar2,7), pcVar9 = pcVar2, pvVar4 != (void *)0x0))
           ))) {
      pcVar2 = pcVar2 + -1;
      pcVar9 = pcVar8;
    }
    pcVar2 = pcVar9 + 1;
    pcVar5 = pcVar8;
    pcVar7 = pcVar8;
    if (pcVar8 < pcVar2) {
      do {
        pcVar1 = pcVar5;
        pcVar7 = pcVar5;
        if (*pcVar5 == ':') break;
        pcVar1 = pcVar5 + 1;
        bVar12 = pcVar5 < pcVar9;
        pcVar5 = pcVar1;
        pcVar7 = pcVar1;
      } while (bVar12);
      while ((pcVar8 < pcVar1 &&
             ((*pcVar1 == 0x3a ||
              (pvVar4 = memchr(" \t\n\v\f\r",(int)*pcVar1,7), pcVar5 = pcVar1, pvVar4 != (void *)0x0
              ))))) {
        pcVar1 = pcVar1 + -1;
        pcVar5 = pcVar8;
      }
    }
    uVar10 = ((int)pcVar5 - (int)pcVar8) + 1;
    uVar3 = 0x1ff;
    if ((int)uVar10 < 0x1ff) {
      uVar3 = uVar10;
    }
    if (uVar10 == 0) {
      sVar11 = (size_t)uVar3;
    }
    else {
      sVar11 = (size_t)(int)uVar3;
      memcpy(local_438,pcVar8,sVar11);
    }
    local_438[sVar11] = '\0';
    pcVar8 = pcVar7;
    if (pcVar7 < pcVar2) {
      do {
        if ((*pcVar7 != 0x3a) &&
           (pvVar4 = memchr(" \t\n\v\f\r",(int)*pcVar7,7), pcVar8 = pcVar7, pvVar4 == (void *)0x0))
        break;
        pcVar8 = pcVar7 + 1;
        bVar12 = pcVar7 < pcVar9;
        pcVar7 = pcVar8;
      } while (bVar12);
    }
    uVar10 = (int)pcVar2 - (int)pcVar8;
    uVar3 = 0x1ff;
    if ((int)uVar10 < 0x1ff) {
      uVar3 = uVar10;
    }
    if (uVar10 == 0) {
      sVar11 = (size_t)uVar3;
    }
    else {
      sVar11 = (size_t)(int)uVar3;
      memcpy(local_238,pcVar8,sVar11);
    }
    local_238[sVar11] = '\0';
    nsvg__parseAttr(p,local_438,local_238);
    str = str + (*str != '\0');
    cVar6 = *str;
  } while( true );
}

Assistant:

static void nsvg__parseStyle(NSVGparser* p, const char* str)
{
	const char* start;
	const char* end;

	while (*str) {
		// Left Trim
		while(*str && nsvg__isspace(*str)) ++str;
		start = str;
		while(*str && *str != ';') ++str;
		end = str;

		// Right Trim
		while (end > start &&  (*end == ';' || nsvg__isspace(*end))) --end;
		++end;

		nsvg__parseNameValue(p, start, end);
		if (*str) ++str;
	}
}